

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_server_transporter.cpp
# Opt level: O2

int __thiscall PipelineServerTransporter::pipe(PipelineServerTransporter *this,int *__pipedes)

{
  uv_pipe_t *handle;
  int iVar1;
  uv_loop_t *puVar2;
  char *in_RDX;
  string fullName;
  size_t len;
  uv_fs_t req;
  char tmp [2048];
  char *local_9f8;
  undefined8 local_9f0;
  char local_9e8 [16];
  size_t local_9d8;
  uv_fs_t local_9d0;
  char local_818 [2048];
  
  puVar2 = uv_default_loop();
  (this->super_Transporter).loop = puVar2;
  local_9f8 = local_9e8;
  local_9f0 = 0;
  local_9e8[0] = '\0';
  local_9d8 = 0x800;
  uv_os_tmpdir(local_818,&local_9d8);
  std::__cxx11::string::assign((char *)&local_9f8);
  std::__cxx11::string::append((char *)&local_9f8);
  std::__cxx11::string::append((string *)&local_9f8);
  uv_fs_unlink((uv_loop_t *)0x0,&local_9d0,local_9f8,(uv_fs_cb)0x0);
  uv_fs_req_cleanup(&local_9d0);
  handle = &this->uvServer;
  (this->uvServer).data = this;
  uv_pipe_init((this->super_Transporter).loop,handle,0);
  iVar1 = uv_pipe_bind(handle,local_9f8);
  if (iVar1 == 0) {
    iVar1 = uv_listen((uv_stream_t *)handle,0x80,onPipeConnectionCB);
    if (iVar1 == 0) {
      iVar1 = (int)CONCAT71((int7)((ulong)in_RDX >> 8),1);
      Transporter::StartEventLoop(&this->super_Transporter);
      goto LAB_0014b6b6;
    }
  }
  uv_err_name(iVar1);
  std::__cxx11::string::assign(in_RDX);
  iVar1 = 0;
LAB_0014b6b6:
  std::__cxx11::string::~string((string *)&local_9f8);
  return iVar1;
}

Assistant:

bool PipelineServerTransporter::pipe(const std::string& name, std::string& err) {
	loop = uv_default_loop();
	std::string fullName;
#ifdef _WIN32
	{
		fullName = "\\\\.\\pipe\\emmylua-";
		fullName.append(name);
	}
#else
    {
		char tmp[2048];
		size_t len = sizeof(tmp);
		uv_os_tmpdir(tmp, &len);
		fullName = tmp;
		fullName.append("/");
		fullName.append(name);
        uv_fs_t req;
        uv_fs_unlink(nullptr, &req, fullName.c_str(), nullptr);
        uv_fs_req_cleanup(&req);
    }
#endif
	uvServer.data = this;
	uv_pipe_init(loop, &uvServer, 0);
	int r = uv_pipe_bind(&uvServer, fullName.c_str());
	if (r) {
		err = uv_err_name(r);
		return false;
	}
	r = uv_listen((uv_stream_t*)&uvServer, 128, onPipeConnectionCB);
	if (r) {
		err = uv_err_name(r);
		return false;
	}
	StartEventLoop();
	return true;
}